

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-dgram-too-big.c
# Opt level: O2

void send_cb(uv_udp_send_t *req,int status)

{
  send_cb_called = send_cb_called + 1;
  return;
}

Assistant:

static void send_cb(uv_udp_send_t* req, int status) {
  CHECK_REQ(req);
  CHECK_HANDLE(req->handle);

  ASSERT(status == UV_EMSGSIZE);

  uv_close((uv_handle_t*)req->handle, close_cb);
  send_cb_called++;
}